

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ClientHook *ptr)

{
  uint uVar1;
  ulong uVar2;
  
  if ((ulong)ptr >> 0x20 == 0) {
    uVar1 = (uint)ptr * 0x8000 + ~(uint)ptr;
    uVar1 = (uVar1 >> 0xc ^ uVar1) * 5;
    uVar1 = (uVar1 >> 4 ^ uVar1) * 0x809;
    return uVar1 >> 0x10 ^ uVar1;
  }
  uVar2 = (long)ptr * 0x40000 + ~(ulong)ptr;
  uVar2 = (uVar2 >> 0x1f ^ uVar2) * 0x15;
  uVar2 = (uVar2 >> 0xb ^ uVar2) * 0x41;
  return (uint)(uVar2 >> 0x16) ^ (uint)uVar2;
}

Assistant:

inline uint intHash64(uint64_t i) {
  // Basic 64-bit integer hash function.
  //
  // Like intHash32(), but where the input is 64 bits.

  // It's important that if the actual value is in the 32-bit range, the hash code is consistent
  // with a 32-bit integer. Otherwise, if you have, say, a `HashMap<uint64_t, T>` and you write
  // `map.find(1)` it won't work, because `1` is type `int` and will be hashed as a 32-bit integer.
  if (i <= UINT32_MAX) {
    return intHash32(i);
  }

#if __CRC32__
  return __builtin_ia32_crc32di(0, i);
#elif __ARM_FEATURE_CRC32
  return __builtin_arm_crc32d(0, i);
#else
  // Thomas Wang hash6432shift() from https://gist.github.com/badboy/6267743
  // This page says it's public domain (inthash.c):
  //     https://github.com/markokr/pghashlib/blob/master/COPYRIGHT
  i = (~i) + (i << 18);
  i = i ^ (i >> 31);
  i = i * 21;
  i = i ^ (i >> 11);
  i = i + (i << 6);
  i = i ^ (i >> 22);
  return i;
#endif
}